

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O0

maybe<(anonymous_namespace)::value,_void> * __thiscall
pstore::maybe<(anonymous_namespace)::value,void>::operator=
          (maybe<(anonymous_namespace)::value,void> *this,value *other)

{
  value *__a;
  undefined1 local_28 [8];
  value temp;
  value *other_local;
  maybe<(anonymous_namespace)::value,_void> *this_local;
  
  temp.v_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
  if (((byte)*this & 1) == 0) {
    anon_unknown.dwarf_717f4::value::value((value *)(this + 8),other);
    *this = (maybe<(anonymous_namespace)::value,void>)0x1;
  }
  else {
    anon_unknown.dwarf_717f4::value::value((value *)local_28,other);
    __a = maybe<(anonymous_namespace)::value,_void>::value
                    ((maybe<(anonymous_namespace)::value,_void> *)this);
    std::swap<(anonymous_namespace)::value>(__a,(value *)local_28);
    anon_unknown.dwarf_717f4::value::~value((value *)local_28);
  }
  return (maybe<(anonymous_namespace)::value,_void> *)this;
}

Assistant:

maybe & operator= (U && other) noexcept (
            std::is_nothrow_copy_assignable<T>::value && std::is_nothrow_copy_constructible<
                T>::value && std::is_nothrow_move_assignable<T>::value &&
                std::is_nothrow_move_constructible<T>::value) {

            if (valid_) {
                T temp = std::forward<U> (other);
                std::swap (this->value (), temp);
            } else {
                new (&storage_) T (std::forward<U> (other));
                valid_ = true;
            }
            return *this;
        }